

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clmul_2bytes.cpp
# Opt level: O0

Sketch * ConstructClMulTri2Bytes(int bits,int implementation)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (Sketch *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

Sketch* ConstructClMulTri2Bytes(int bits, int implementation) {
    switch (bits) {
#ifdef ENABLE_FIELD_INT_9
    case 9: return new SketchImpl<FieldTri9>(implementation, 9);
#endif
#ifdef ENABLE_FIELD_INT_10
    case 10: return new SketchImpl<FieldTri10>(implementation, 10);
#endif
#ifdef ENABLE_FIELD_INT_11
    case 11: return new SketchImpl<FieldTri11>(implementation, 11);
#endif
#ifdef ENABLE_FIELD_INT_12
    case 12: return new SketchImpl<FieldTri12>(implementation, 12);
#endif
#ifdef ENABLE_FIELD_INT_14
    case 14: return new SketchImpl<FieldTri14>(implementation, 14);
#endif
#ifdef ENABLE_FIELD_INT_15
    case 15: return new SketchImpl<FieldTri15>(implementation, 15);
#endif
    }
    return nullptr;
}